

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O1

void MOJOSHADER_glDestroyContext(MOJOSHADER_glContext *_ctx)

{
  MOJOSHADER_glContext *pMVar1;
  
  pMVar1 = ctx;
  ctx = _ctx;
  MOJOSHADER_glBindProgram((MOJOSHADER_glProgram *)0x0);
  if (ctx->linker_cache != (HashTable *)0x0) {
    hash_destroy(ctx->linker_cache);
  }
  lookup_entry_points((MOJOSHADER_glGetProcAddress)0x0,(void *)0x0);
  if (ctx != (MOJOSHADER_glContext *)0x0) {
    (*ctx->free_fn)(ctx,ctx->malloc_data);
  }
  ctx = (MOJOSHADER_glContext *)0x0;
  if (pMVar1 != _ctx) {
    ctx = pMVar1;
  }
  return;
}

Assistant:

void MOJOSHADER_glDestroyContext(MOJOSHADER_glContext *_ctx)
{
    MOJOSHADER_glContext *current_ctx = ctx;
    ctx = _ctx;
    MOJOSHADER_glBindProgram(NULL);
    if (ctx->linker_cache)
        hash_destroy(ctx->linker_cache);
    lookup_entry_points(NULL, NULL);   // !!! FIXME: is there a value to this?
    Free(ctx);
    ctx = ((current_ctx == _ctx) ? NULL : current_ctx);
}